

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cpp
# Opt level: O2

shared_ptr<index_tree> __thiscall dfa::create_index_tree(dfa *this,wchar_t key)

{
  iterator iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<index_tree> *tree;
  undefined4 in_register_00000034;
  pair<std::__detail::_Node_iterator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false,_false>,_bool>
  pVar3;
  shared_ptr<index_tree> sVar4;
  key_type local_14;
  
  iVar1 = std::
          _Hashtable<wchar_t,_std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<wchar_t,_std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_std::allocator<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>_>,_std::__detail::_Select1st,_std::equal_to<wchar_t>,_std::hash<wchar_t>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)CONCAT44(in_register_00000034,key),&local_14);
  if (iVar1.super__Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::make_shared<index_tree>();
    pVar3 = std::
            _Hashtable<wchar_t,std::pair<wchar_t_const,std::shared_ptr<index_tree>>,std::allocator<std::pair<wchar_t_const,std::shared_ptr<index_tree>>>,std::__detail::_Select1st,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<wchar_t&,std::shared_ptr<index_tree>&>
                      ((_Hashtable<wchar_t,std::pair<wchar_t_const,std::shared_ptr<index_tree>>,std::allocator<std::pair<wchar_t_const,std::shared_ptr<index_tree>>>,std::__detail::_Select1st,std::equal_to<wchar_t>,std::hash<wchar_t>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)CONCAT44(in_register_00000034,key),&local_14,this);
    _Var2._M_pi = pVar3._8_8_;
  }
  else {
    std::__shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_wchar_t,_std::shared_ptr<index_tree>_>,_false>
                      ._M_cur + 0x10));
    _Var2._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar4.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<index_tree>)sVar4.super___shared_ptr<index_tree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<index_tree> dfa::create_index_tree(wchar_t key)
{
    auto iter = index_trees_.find(key);
    if (iter == index_trees_.end())
    {
        auto tree = std::make_shared<index_tree>();
        index_trees_.emplace(key, tree);
        return tree;
    }
    return iter->second;
}